

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.cc
# Opt level: O0

void __thiscall serial::Serial::flush(Serial *this)

{
  ScopedWriteLock local_20;
  ScopedWriteLock wlock;
  ScopedReadLock rlock;
  Serial *this_local;
  
  ScopedReadLock::ScopedReadLock((ScopedReadLock *)&wlock,this->pimpl_);
  ScopedWriteLock::ScopedWriteLock(&local_20,this->pimpl_);
  SerialImpl::flush(this->pimpl_);
  ScopedWriteLock::~ScopedWriteLock(&local_20);
  ScopedReadLock::~ScopedReadLock((ScopedReadLock *)&wlock);
  return;
}

Assistant:

void Serial::flush ()
{
  ScopedReadLock rlock(this->pimpl_);
  ScopedWriteLock wlock(this->pimpl_);
  pimpl_->flush ();
}